

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

void append_entry_w(wchar_t **wp,wchar_t *prefix,wchar_t type,wchar_t tag,wchar_t flags,
                   wchar_t *wname,wchar_t perm,wchar_t id)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  wchar_t wVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 local_38;
  
  local_38 = CONCAT44(type,id);
  if (prefix != (wchar_t *)0x0) {
    wcscpy(*wp,prefix);
    pwVar4 = *wp;
    sVar2 = wcslen(pwVar4);
    *wp = pwVar4 + sVar2;
  }
  switch(tag) {
  case L'✑':
    pwVar4 = *wp;
LAB_00477bf0:
    piVar7 = anon_var_dwarf_c5b905;
    goto LAB_00477bf7;
  case L'✒':
    pwVar4 = *wp;
    if ((type & 0x3c00U) == 0) {
      wname = (wchar_t *)0x0;
      local_38 = CONCAT44(type,0xffffffff);
      goto LAB_00477bf0;
    }
    piVar7 = anon_var_dwarf_c5b927;
LAB_00477bad:
    wcscpy(pwVar4,piVar7);
    local_38 = CONCAT44(type,0xffffffff);
    wname = (wchar_t *)0x0;
    goto LAB_00477bfc;
  case L'✓':
    pwVar4 = *wp;
    goto LAB_00477bde;
  case L'✔':
    pwVar4 = *wp;
    if ((type & 0x3c00U) != 0) {
      piVar7 = anon_var_dwarf_c5b932;
      goto LAB_00477bad;
    }
    wname = (wchar_t *)0x0;
    local_38 = CONCAT44(type,0xffffffff);
LAB_00477bde:
    piVar7 = anon_var_dwarf_c5b910;
LAB_00477bf7:
    wcscpy(pwVar4,piVar7);
    goto LAB_00477bfc;
  case L'✕':
    pwVar4 = *wp;
    piVar7 = anon_var_dwarf_c5ba4a;
    break;
  case L'✖':
    pwVar4 = *wp;
    piVar7 = anon_var_dwarf_c5ba55;
    break;
  default:
    if (tag != L'❻') goto LAB_00477bfc;
    pwVar4 = *wp;
    piVar7 = anon_var_dwarf_c5b93d;
  }
  wcscpy(pwVar4,piVar7);
  wname = (wchar_t *)0x0;
  local_38 = CONCAT44(type,0xffffffff);
LAB_00477bfc:
  pwVar4 = *wp;
  sVar2 = wcslen(pwVar4);
  pwVar4 = pwVar4 + sVar2;
  *wp = pwVar4 + 1;
  *pwVar4 = L':';
  if (((local_38 & 0x30000000000) != 0) || ((tag | 2U) == 0x2713)) {
    wVar6 = (wchar_t)local_38;
    if (wname == (wchar_t *)0x0) {
      if ((tag | 2U) == 0x2713) {
        append_id_w(wp,(wchar_t)local_38);
        wVar6 = (wchar_t)local_38 | -(uint)((local_38 & 0x3c0000000000) == 0);
      }
    }
    else {
      wcscpy(pwVar4 + 1,wname);
      pwVar4 = *wp;
      sVar2 = wcslen(pwVar4);
      *wp = pwVar4 + sVar2;
    }
    if ((0xfffffffdU < (uint)(tag + L'\xffffd8e9') & (byte)((uint)(flags & 4U) >> 2)) == 0) {
      pwVar4 = *wp;
      *wp = pwVar4 + 1;
      *pwVar4 = L':';
    }
    uVar9 = local_38 & 0x30000000000;
    local_38._0_4_ = wVar6;
    if (uVar9 != 0) {
      pwVar4 = *wp;
      uVar9 = CONCAT44(-(uint)((perm & 0x92U) == 0),-(uint)((perm & 0x124U) == 0));
      wVar6 = L'x';
      if ((perm & 0x49U) == 0) {
        wVar6 = L'-';
      }
      *(ulong *)pwVar4 = uVar9 & (ulong)DAT_00534880 | ~uVar9 & (ulong)DAT_00534870;
      pwVar5 = pwVar4 + 3;
      *wp = pwVar5;
      pwVar4[2] = wVar6;
      goto LAB_00477dea;
    }
  }
  for (lVar3 = 8; lVar3 != 0xb0; lVar3 = lVar3 + 0xc) {
    if ((*(uint *)(&UNK_00534728 + lVar3) & perm) == 0) {
      wVar6 = L'-';
      if ((flags & 0x10U) == 0) goto LAB_00477d42;
    }
    else {
      wVar6 = *(wchar_t *)((long)&nfsv4_acl_perm_map[0].perm + lVar3);
LAB_00477d42:
      pwVar4 = *wp;
      *wp = pwVar4 + 1;
      *pwVar4 = wVar6;
    }
  }
  pwVar4 = *wp;
  *pwVar4 = L':';
  pwVar4 = pwVar4 + 1;
  for (lVar3 = 8; lVar3 != 0x5c; lVar3 = lVar3 + 0xc) {
    if ((*(uint *)(&UNK_005347d8 + lVar3) & perm) == 0) {
      wVar6 = L'-';
      if ((flags & 0x10U) == 0) goto LAB_00477d87;
    }
    else {
      wVar6 = *(wchar_t *)((long)&nfsv4_acl_flag_map[0].perm + lVar3);
LAB_00477d87:
      *wp = pwVar4 + 1;
      *pwVar4 = wVar6;
      pwVar4 = pwVar4 + 1;
    }
  }
  *wp = pwVar4 + 1;
  *pwVar4 = L':';
  uVar1 = local_38._4_4_ - 0x400U >> 10;
  uVar8 = local_38._4_4_ << 0x16 | uVar1;
  if ((uVar8 < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    wcscpy(pwVar4 + 1,(wchar_t *)(&DAT_00534834 + *(int *)(&DAT_00534834 + (ulong)uVar8 * 4)));
  }
  pwVar5 = *wp;
  sVar2 = wcslen(pwVar5);
  pwVar5 = pwVar5 + sVar2;
  *wp = pwVar5;
LAB_00477dea:
  if ((wchar_t)local_38 == L'\xffffffff') {
    return;
  }
  *wp = pwVar5 + 1;
  *pwVar5 = L':';
  append_id_w(wp,(wchar_t)local_38);
  return;
}

Assistant:

static void
append_entry_w(wchar_t **wp, const wchar_t *prefix, int type,
    int tag, int flags, const wchar_t *wname, int perm, int id)
{
	int i;

	if (prefix != NULL) {
		wcscpy(*wp, prefix);
		*wp += wcslen(*wp);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		wname = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			wcscpy(*wp, L"owner@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		wcscpy(*wp, L"user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		wname = NULL;
		id = -1;
		if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
			wcscpy(*wp, L"group@");
			break;
		}
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		wcscpy(*wp, L"group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		wcscpy(*wp, L"mask");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		wcscpy(*wp, L"other");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_EVERYONE:
		wcscpy(*wp, L"everyone@");
		wname = NULL;
		id = -1;
		break;
	}
	*wp += wcslen(*wp);
	*(*wp)++ = L':';
	if (((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) ||
	    tag == ARCHIVE_ENTRY_ACL_USER ||
	    tag == ARCHIVE_ENTRY_ACL_GROUP) {
		if (wname != NULL) {
			wcscpy(*wp, wname);
			*wp += wcslen(*wp);
		} else if (tag == ARCHIVE_ENTRY_ACL_USER
		    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
			append_id_w(wp, id);
			if ((type & ARCHIVE_ENTRY_ACL_TYPE_NFS4) == 0)
				id = -1;
		}
		/* Solaris style has no second colon after other and mask */
		if (((flags & ARCHIVE_ENTRY_ACL_STYLE_SOLARIS) == 0)
		    || (tag != ARCHIVE_ENTRY_ACL_OTHER
		    && tag != ARCHIVE_ENTRY_ACL_MASK))
			*(*wp)++ = L':';
	}
	if ((type & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0) {
		/* POSIX.1e ACL perms */
		*(*wp)++ = (perm & 0444) ? L'r' : L'-';
		*(*wp)++ = (perm & 0222) ? L'w' : L'-';
		*(*wp)++ = (perm & 0111) ? L'x' : L'-';
	} else {
		/* NFSv4 ACL perms */
		for (i = 0; i < nfsv4_acl_perm_map_size; i++) {
			if (perm & nfsv4_acl_perm_map[i].perm)
				*(*wp)++ = nfsv4_acl_perm_map[i].wc;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*wp)++ = L'-';
		}
		*(*wp)++ = L':';
		for (i = 0; i < nfsv4_acl_flag_map_size; i++) {
			if (perm & nfsv4_acl_flag_map[i].perm)
				*(*wp)++ = nfsv4_acl_flag_map[i].wc;
			else if ((flags & ARCHIVE_ENTRY_ACL_STYLE_COMPACT) == 0)
				*(*wp)++ = L'-';
		}
		*(*wp)++ = L':';
		switch (type) {
		case ARCHIVE_ENTRY_ACL_TYPE_ALLOW:
			wcscpy(*wp, L"allow");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_DENY:
			wcscpy(*wp, L"deny");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_AUDIT:
			wcscpy(*wp, L"audit");
			break;
		case ARCHIVE_ENTRY_ACL_TYPE_ALARM:
			wcscpy(*wp, L"alarm");
			break;
		default:
			break;
		}
		*wp += wcslen(*wp);
	}
	if (id != -1) {
		*(*wp)++ = L':';
		append_id_w(wp, id);
	}
}